

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseVarOpt(WastParser *this,Var *out_var,Var *default_var)

{
  TokenType TVar1;
  Result RVar2;
  
  TVar1 = Peek(this,0);
  if ((TVar1 != Last_Literal) && (TVar1 = Peek(this,0), TVar1 != Last_String)) {
    Var::operator=(out_var,default_var);
    return false;
  }
  RVar2 = ParseVar(this,out_var);
  if (RVar2.enum_ == Ok) {
    return true;
  }
  __assert_fail("Succeeded(result)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                ,0x31b,"bool wabt::WastParser::ParseVarOpt(Var *, Var)");
}

Assistant:

bool WastParser::ParseVarOpt(Var* out_var, Var default_var) {
  WABT_TRACE(ParseVarOpt);
  if (PeekMatch(TokenType::Nat) || PeekMatch(TokenType::Var)) {
    Result result = ParseVar(out_var);
    // Should always succeed, the only way it could fail is if the token
    // doesn't match.
    assert(Succeeded(result));
    WABT_USE(result);
    return true;
  } else {
    *out_var = default_var;
    return false;
  }
}